

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O2

int __thiscall Fl_Browser_::deselect(Fl_Browser_ *this,int docallbacks)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  fd_set *in_R8;
  timeval *in_R9;
  uint uVar4;
  long lVar3;
  
  if ((this->super_Fl_Group).super_Fl_Widget.type_ == '\x03') {
    iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
    uVar4 = 0;
    lVar3 = CONCAT44(extraout_var,iVar1);
    while (lVar3 != 0) {
      uVar2 = select(this,(int)lVar3,(fd_set *)0x0,(fd_set *)(ulong)(uint)docallbacks,in_R8,in_R9);
      uVar4 = uVar4 | uVar2;
      iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,lVar3);
      lVar3 = CONCAT44(extraout_var_00,iVar1);
    }
  }
  else if (this->selection_ == (void *)0x0) {
    uVar4 = 0;
  }
  else {
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x18])(this,this->selection_,0);
    redraw_line(this,this->selection_);
    this->selection_ = (void *)0x0;
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int Fl_Browser_::deselect(int docallbacks) {
  if (type() == FL_MULTI_BROWSER) {
    int change = 0;
    for (void* p = item_first(); p; p = item_next(p))
      change |= select(p, 0, docallbacks);
    return change;
  } else {
    if (!selection_) return 0;
    item_select(selection_, 0);
    redraw_line(selection_);
    selection_ = 0;
    return 1;
  }
}